

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_easysrc.c
# Opt level: O2

CURLcode easysrc_add(slist_wc **plist,char *line)

{
  CURLcode CVar1;
  slist_wc *psVar2;
  
  psVar2 = slist_wc_append(*plist,line);
  if (psVar2 == (slist_wc *)0x0) {
    easysrc_free();
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    *plist = psVar2;
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode easysrc_add(struct slist_wc **plist, const char *line)
{
  CURLcode ret = CURLE_OK;
  struct slist_wc *list = slist_wc_append(*plist, line);
  if(!list) {
    easysrc_free();
    ret = CURLE_OUT_OF_MEMORY;
  }
  else
    *plist = list;
  return ret;
}